

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_optype_call(lua_State *L,TValue *o)

{
  uint uVar1;
  char *pcVar2;
  undefined4 *in_RSI;
  lua_State *in_RDI;
  char *tname;
  BCIns *pc;
  uint local_28;
  uint local_24;
  
  uVar1 = *(uint *)(((ulong)in_RDI->cframe & 0xfffffffffffffffc) + 0x1c);
  if ((uVar1 & 3) != 0) {
    if ((uint)in_RSI[1] < 0xffff0000) {
      local_24 = 0xd;
    }
    else {
      if ((int)in_RSI[1] >> 0xf == -2) {
        local_28 = 3;
      }
      else {
        local_28 = in_RSI[1] ^ 0xffffffff;
      }
      local_24 = local_28;
    }
    pcVar2 = lj_obj_itypename[local_24];
    *in_RSI = (int)in_RDI;
    in_RSI[1] = uVar1;
    in_RDI->base = (TValue *)(in_RSI + 2);
    in_RDI->top = (TValue *)(in_RSI + 2);
    err_msgv(in_RDI,LJ_ERR_BADCALL,pcVar2);
  }
  lj_err_optype(L,o,pc._4_4_);
}

Assistant:

LJ_NOINLINE void lj_err_optype_call(lua_State *L, TValue *o)
{
  /* Gross hack if lua_[p]call or pcall/xpcall fail for a non-callable object:
  ** L->base still points to the caller. So add a dummy frame with L instead
  ** of a function. See lua_getstack().
  */
  const BCIns *pc = cframe_Lpc(L);
  if (((ptrdiff_t)pc & FRAME_TYPE) != FRAME_LUA) {
    const char *tname = lj_typename(o);
    setframe_gc(o, obj2gco(L), LJ_TTHREAD);
    if (LJ_FR2) o++;
    setframe_pc(o, pc);
    L->top = L->base = o+1;
    err_msgv(L, LJ_ERR_BADCALL, tname);
  }
  lj_err_optype(L, o, LJ_ERR_OPCALL);
}